

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O2

Point2f __thiscall pbrt::SobolSampler::Get2D(SobolSampler *this)

{
  undefined1 auVar1 [16];
  float fVar2;
  undefined8 uVar3;
  Tuple2<pbrt::Point2,_float> TVar4;
  int iVar5;
  int iVar6;
  long in_FS_OFFSET;
  bool bVar7;
  Float FVar8;
  Point2f u;
  
  iVar6 = this->dimension;
  if (0x3fe < iVar6) {
    this->dimension = 2;
    iVar6 = 2;
  }
  FVar8 = sampleDimension(this,iVar6);
  u.super_Tuple2<pbrt::Point2,_float>.y = sampleDimension(this,this->dimension + 1);
  u.super_Tuple2<pbrt::Point2,_float>.x = FVar8;
  iVar6 = this->dimension;
  if (iVar6 == 0) {
    iVar6 = 2;
    while( true ) {
      if (iVar6 == 0) break;
      bVar7 = iVar6 != 2;
      (&u.super_Tuple2<pbrt::Point2,_float>.x)[bVar7] =
           (float)this->resolution * (&u.super_Tuple2<pbrt::Point2,_float>.x)[bVar7];
      if (Get2D()::reg == '\0') {
        iVar5 = __cxa_guard_acquire(&Get2D()::reg);
        if (iVar5 != 0) {
          StatRegisterer::StatRegisterer
                    ((StatRegisterer *)&Get2D()::reg,
                     Get2D()::{lambda(pbrt::StatsAccumulator&)#1}::StatsAccumulator__,
                     (PixelAccumFunc)0x0);
          __cxa_guard_release(&Get2D()::reg);
        }
      }
      *(long *)(in_FS_OFFSET + -0x660) = *(long *)(in_FS_OFFSET + -0x660) + 1;
      if ((&u.super_Tuple2<pbrt::Point2,_float>.x)[bVar7] <
          (float)(&(this->pixel).super_Tuple2<pbrt::Point2,_int>.x)[iVar6 != 2]) {
        *(long *)(in_FS_OFFSET + -0x668) = *(long *)(in_FS_OFFSET + -0x668) + 1;
      }
      if (Get2D()::reg == '\0') {
        iVar5 = __cxa_guard_acquire(&Get2D()::reg);
        if (iVar5 != 0) {
          StatRegisterer::StatRegisterer
                    ((StatRegisterer *)&Get2D()::reg,
                     Get2D()::{lambda(pbrt::StatsAccumulator&)#2}::StatsAccumulator__,
                     (PixelAccumFunc)0x0);
          __cxa_guard_release(&Get2D()::reg);
        }
      }
      *(long *)(in_FS_OFFSET + -0x650) = *(long *)(in_FS_OFFSET + -0x650) + 1;
      fVar2 = (&u.super_Tuple2<pbrt::Point2,_float>.x)[bVar7] -
              (float)(&(this->pixel).super_Tuple2<pbrt::Point2,_int>.x)[iVar6 != 2];
      if (1.0 < fVar2) {
        *(long *)(in_FS_OFFSET + -0x658) = *(long *)(in_FS_OFFSET + -0x658) + 1;
      }
      uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar2),ZEXT816(0) << 0x40,1);
      auVar1 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),ZEXT416((uint)fVar2));
      (&u.super_Tuple2<pbrt::Point2,_float>.x)[bVar7] =
           (float)((uint)!(bool)((byte)uVar3 & 1) * auVar1._0_4_);
      iVar6 = iVar6 + -1;
    }
    iVar6 = this->dimension;
  }
  this->dimension = iVar6 + 2;
  TVar4.y = u.super_Tuple2<pbrt::Point2,_float>.y;
  TVar4.x = u.super_Tuple2<pbrt::Point2,_float>.x;
  return (Point2f)TVar4;
}

Assistant:

PBRT_CPU_GPU
    Point2f Get2D() {
        if (dimension + 1 >= NSobolDimensions)
            dimension = 2;

        Point2f u(sampleDimension(dimension), sampleDimension(dimension + 1));
        if (dimension == 0) {
            // Remap Sobol$'$ dimensions used for pixel samples
            for (int dim = 0; dim < 2; ++dim) {
                u[dim] = u[dim] * resolution;
                CHECK_RARE(1e-7, u[dim] - pixel[dim] < 0);
                CHECK_RARE(1e-7, u[dim] - pixel[dim] > 1);
                u[dim] = Clamp(u[dim] - pixel[dim], (Float)0, OneMinusEpsilon);
            }
        }
        dimension += 2;
        return u;
    }